

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::ToLower(FString *this)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  
  LockBuffer(this);
  uVar1 = *(uint *)(this->Chars + -0xc);
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    pcVar2 = this->Chars;
    iVar3 = tolower((int)pcVar2[uVar4]);
    pcVar2[uVar4] = (char)iVar3;
  }
  UnlockBuffer(this);
  return;
}

Assistant:

void FString::ToLower ()
{
	LockBuffer();
	size_t max = Len();
	for (size_t i = 0; i < max; ++i)
	{
		Chars[i] = (char)tolower(Chars[i]);
	}
	UnlockBuffer();
}